

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan.c
# Opt level: O1

GLFWvkproc glfwGetInstanceProcAddress(VkInstance instance,char *procname)

{
  GLFWbool GVar1;
  int iVar2;
  PFN_vkGetInstanceProcAddr p_Var3;
  GLFWproc p_Var4;
  
  if (procname == (char *)0x0) {
    __assert_fail("procname != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/glfw/src/vulkan.c"
                  ,0xfa,"GLFWvkproc glfwGetInstanceProcAddress(VkInstance, const char *)");
  }
  if (_glfw.initialized == 0) {
    p_Var3 = (PFN_vkGetInstanceProcAddr)0x0;
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    GVar1 = _glfwInitVulkan(2);
    if (GVar1 == 0) {
      p_Var3 = (PFN_vkGetInstanceProcAddr)0x0;
    }
    else {
      iVar2 = strcmp(procname,"vkGetInstanceProcAddr");
      p_Var3 = _glfw.vk.GetInstanceProcAddr;
      if (iVar2 != 0) {
        p_Var3 = (PFN_vkGetInstanceProcAddr)(*_glfw.vk.GetInstanceProcAddr)(instance,procname);
        if (_glfw.vk.handle != (void *)0x0 && p_Var3 == (PFN_vkGetInstanceProcAddr)0x0) {
          p_Var4 = _glfwPlatformGetModuleSymbol(_glfw.vk.handle,procname);
          return p_Var4;
        }
      }
    }
  }
  return (GLFWvkproc)p_Var3;
}

Assistant:

GLFWAPI GLFWvkproc glfwGetInstanceProcAddress(VkInstance instance,
                                              const char* procname)
{
    GLFWvkproc proc;
    assert(procname != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (!_glfwInitVulkan(_GLFW_REQUIRE_LOADER))
        return NULL;

    // NOTE: Vulkan 1.0 and 1.1 vkGetInstanceProcAddr cannot return itself
    if (strcmp(procname, "vkGetInstanceProcAddr") == 0)
        return (GLFWvkproc) vkGetInstanceProcAddr;

    proc = (GLFWvkproc) vkGetInstanceProcAddr(instance, procname);
    if (!proc)
    {
        if (_glfw.vk.handle)
            proc = (GLFWvkproc) _glfwPlatformGetModuleSymbol(_glfw.vk.handle, procname);
    }

    return proc;
}